

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O2

bool __thiscall ON_BrepEdgeArray::Read(ON_BrepEdgeArray *this,ON_BinaryArchive *file)

{
  bool bVar1;
  uint uVar2;
  ON_BrepEdge *pOVar3;
  byte bVar4;
  int iVar5;
  int major_version;
  int count;
  int minor_version;
  ON__UINT32 tcode;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK;
  int local_38;
  ON__INT32 local_34;
  int local_30;
  uint local_2c;
  ON__INT64 local_28;
  
  ON_ClassArray<ON_BrepEdge>::Empty((ON_ClassArray<ON_BrepEdge> *)this);
  local_2c = 0;
  local_28 = 0;
  local_34 = 0;
  local_38 = 0;
  local_30 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk(file,&local_2c,&local_28);
  if (bVar1) {
    if (local_2c == 0x40008000) {
      bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_38,&local_30);
      bVar4 = 0;
      if ((bVar1) && (bVar4 = 0, local_38 == 1)) {
        bVar1 = ON_BinaryArchive::ReadInt(file,&local_34);
        uVar2 = (uint)bVar1;
        ON_ClassArray<ON_BrepEdge>::SetCapacity((ON_ClassArray<ON_BrepEdge> *)this,(long)local_34);
        for (iVar5 = 0; (bVar4 = (byte)uVar2, (uVar2 & 1) != 0 && (iVar5 < local_34));
            iVar5 = iVar5 + 1) {
          pOVar3 = ON_ClassArray<ON_BrepEdge>::AppendNew((ON_ClassArray<ON_BrepEdge> *)this);
          uVar2 = (*(pOVar3->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                    _vptr_ON_Object[0xb])(pOVar3,file);
        }
      }
    }
    else {
      bVar4 = 0;
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(file);
    bVar1 = (bool)(bVar1 & bVar4);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_BrepEdgeArray::Read( ON_BinaryArchive& file )
{
  Empty();
  ON__UINT32 tcode = 0;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
  int count = 0;
  int i;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
  if (rc) {
    if (tcode != TCODE_ANONYMOUS_CHUNK)
      rc = false;
    if (rc) rc = file.Read3dmChunkVersion(&major_version,&minor_version);
    if (rc) {
      if ( major_version==1 ) {
        if (rc) rc = file.ReadInt(&count);
        SetCapacity(count);
        for ( i = 0; i < count && rc ; i++ ) {
          ON_BrepEdge& edge = AppendNew();
          rc = edge.Read(file) ? true : false;
        }    
      }
      else {
        rc = 0;
      }
    }
    if ( !file.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}